

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeConstraints.cpp
# Opt level: O3

int __thiscall
OpenMD::FluctuatingChargeConstraints::getNumberOfFlucQAtoms(FluctuatingChargeConstraints *this)

{
  pointer ppAVar1;
  Atom *pAVar2;
  Molecule *pMVar3;
  pointer ppAVar4;
  int iVar5;
  int iVar6;
  MoleculeIterator i;
  MoleculeIterator local_20;
  
  if (this->initialized_ == false) {
    if ((this->info_->usesFluctuatingCharges_ == true) &&
       (0 < this->info_->nGlobalFluctuatingCharges_)) {
      this->hasFlucQ_ = true;
    }
    this->initialized_ = true;
  }
  iVar6 = 0;
  if (this->hasFlucQ_ == true) {
    local_20._M_node = (_Base_ptr)0x0;
    pMVar3 = SimInfo::beginMolecule(this->info_,&local_20);
    iVar5 = 0;
    iVar6 = 0;
    if (pMVar3 != (Molecule *)0x0) {
      do {
        if (pMVar3->constrainTotalCharge_ == true) {
          iVar5 = iVar5 + (int)((ulong)((long)(pMVar3->fluctuatingCharges_).
                                              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(pMVar3->fluctuatingCharges_).
                                             super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
        }
        else {
          ppAVar4 = (pMVar3->fluctuatingCharges_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          ppAVar1 = (pMVar3->fluctuatingCharges_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if ((pMVar3->molStamp_->region_ < 0) || (this->constrainRegions_ == false)) {
            if (ppAVar4 != ppAVar1) {
              pAVar2 = *ppAVar4;
              while (pAVar2 != (Atom *)0x0) {
                iVar5 = iVar5 + 1;
                ppAVar4 = ppAVar4 + 1;
                if (ppAVar4 == ppAVar1) break;
                pAVar2 = *ppAVar4;
              }
            }
          }
          else if (ppAVar4 != ppAVar1) {
            pAVar2 = *ppAVar4;
            while (pAVar2 != (Atom *)0x0) {
              iVar5 = iVar5 + 1;
              ppAVar4 = ppAVar4 + 1;
              if (ppAVar4 == ppAVar1) break;
              pAVar2 = *ppAVar4;
            }
          }
        }
        pMVar3 = SimInfo::nextMolecule(this->info_,&local_20);
        iVar6 = iVar5;
      } while (pMVar3 != (Molecule *)0x0);
    }
  }
  return iVar6;
}

Assistant:

int FluctuatingChargeConstraints::getNumberOfFlucQAtoms() {
    int nFlucq = 0;
    if (!initialized_) initialize();
    if (!hasFlucQ_) return 0;
    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      if (mol->constrainTotalCharge()) {
        nFlucq += mol->getNFluctuatingCharges();
      } else {
        int region = mol->getRegion();
        if (constrainRegions_ && region >= 0) {
          for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
               atom = mol->nextFluctuatingCharge(j)) {
            nFlucq++;
          }
        } else {
          for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
               atom = mol->nextFluctuatingCharge(j)) {
            nFlucq++;
          }
        }
      }
    }
    return nFlucq;
  }